

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_skeletons.cpp
# Opt level: O0

UNumberDecimalSeparatorDisplay
icu_63::number::impl::stem_to_object::decimalSeparatorDisplay(StemEnum stem)

{
  undefined4 local_c;
  StemEnum stem_local;
  
  if (stem == STEM_DECIMAL_AUTO) {
    local_c = UNUM_DECIMAL_SEPARATOR_AUTO;
  }
  else if (stem == STEM_DECIMAL_ALWAYS) {
    local_c = UNUM_DECIMAL_SEPARATOR_ALWAYS;
  }
  else {
    local_c = UNUM_DECIMAL_SEPARATOR_COUNT;
  }
  return local_c;
}

Assistant:

UNumberDecimalSeparatorDisplay stem_to_object::decimalSeparatorDisplay(skeleton::StemEnum stem) {
    switch (stem) {
        case STEM_DECIMAL_AUTO:
            return UNUM_DECIMAL_SEPARATOR_AUTO;
        case STEM_DECIMAL_ALWAYS:
            return UNUM_DECIMAL_SEPARATOR_ALWAYS;
        default:
            return UNUM_DECIMAL_SEPARATOR_COUNT; // for objects, throw; for enums, return COUNT
    }
}